

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

void print_voice_list(OpenJTalk *openjtalk)

{
  size_t sVar1;
  undefined8 in_RDI;
  size_t diff;
  HtsVoiceFilelist *list_1;
  int tab_len;
  size_t len;
  HtsVoiceFilelist *list;
  size_t length;
  HtsVoiceFilelist *result;
  char padding [260];
  long local_150;
  undefined8 *local_148;
  undefined8 *local_130;
  ulong local_128;
  char local_118 [280];
  
  local_148 = (undefined8 *)openjtalk_getHTSVoiceList(in_RDI);
  local_128 = 0;
  for (local_130 = local_148; local_130 != (undefined8 *)0x0; local_130 = (undefined8 *)*local_130)
  {
    sVar1 = strlen((char *)local_130[2]);
    if (local_128 < sVar1) {
      local_128 = sVar1;
    }
  }
  for (; local_148 != (undefined8 *)0x0; local_148 = (undefined8 *)*local_148) {
    sVar1 = strlen((char *)local_148[2]);
    local_150 = ((local_128 / 4) * 4 + 4) - sVar1;
    strcpy(local_118," ");
    while (local_150 = local_150 + -1, local_150 != 0) {
      strcat(local_118," ");
    }
    printf("%s%s%s\n",local_148[2],local_118,local_148[1]);
  }
  return;
}

Assistant:

void print_voice_list(OpenJTalk *openjtalk)
{
	char padding[MAX_PATH];
	HtsVoiceFilelist *result = openjtalk_getHTSVoiceList(openjtalk);
	size_t length = 0;

	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t len = strlen(list->name);
		if (length < len)
		{
			length = len;
		}
	}
	int tab_len = 4;
	length = (length / tab_len) * tab_len + tab_len;
	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t diff = length - strlen((char*)list->name);
		strcpy(padding, " ");
		while (--diff)
		{
			strcat(padding, " ");
		}
		printf("%s%s%s\n", (char*)list->name, padding, (char*)list->path);
	}
}